

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Metrics.cpp
# Opt level: O2

Pass * wasm::createFunctionMetricsPass(void)

{
  Metrics *this;
  
  this = (Metrics *)operator_new(0x168);
  Metrics::Metrics(this,true);
  return (Pass *)this;
}

Assistant:

Pass* createFunctionMetricsPass() { return new Metrics(true); }